

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void test4(void)

{
  bool bVar1;
  undefined1 local_1f [8];
  varchar<11UL> rhs;
  varchar<10UL> lhs;
  
  varchar<10UL>::varchar((varchar<10UL> *)(rhs.data_ + 4),"test");
  varchar<11UL>::varchar((varchar<11UL> *)local_1f,"hello");
  bVar1 = varchar<10ul>::operator!=((varchar<10ul> *)(rhs.data_ + 4),(varchar<11UL> *)local_1f);
  if (!bVar1) {
    __assert_fail("lhs != rhs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mpapierski[P]varchar/tests/test_suite.cpp"
                  ,0x1e,"void test4()");
  }
  bVar1 = varchar<11ul>::operator!=((varchar<11ul> *)local_1f,(varchar<10UL> *)(rhs.data_ + 4));
  if (!bVar1) {
    __assert_fail("rhs != lhs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mpapierski[P]varchar/tests/test_suite.cpp"
                  ,0x1f,"void test4()");
  }
  bVar1 = varchar<10ul>::operator==((varchar<10ul> *)(rhs.data_ + 4),(varchar<11UL> *)local_1f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(lhs == rhs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mpapierski[P]varchar/tests/test_suite.cpp"
                  ,0x20,"void test4()");
  }
  bVar1 = varchar<11ul>::operator==((varchar<11ul> *)local_1f,(varchar<10UL> *)(rhs.data_ + 4));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(rhs == lhs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mpapierski[P]varchar/tests/test_suite.cpp"
                  ,0x21,"void test4()");
  }
  return;
}

Assistant:

void test4()
{
	varchar<10> lhs = "test";
	varchar<11> rhs = "hello";
	assert(lhs != rhs);
	assert(rhs != lhs);
	assert(!(lhs == rhs));
	assert(!(rhs == lhs));
}